

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
Measurements::BenchmarkBase<Measurements::AllocCount>::run_poly_vec
          (BenchmarkBase<Measurements::AllocCount> *this)

{
  _func_int **pp_Var1;
  uint uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  
  uVar2 = this->iteration_count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pp_Var4 = this[1].super_Benchmark._vptr_Benchmark;
      pp_Var1 = *(_func_int ***)&this[1].iteration_count;
      if (pp_Var4 != pp_Var1) {
        do {
          (*(code *)**(undefined8 **)pp_Var4[2])();
          pp_Var4 = pp_Var4 + 5;
        } while (pp_Var4 != pp_Var1);
        uVar2 = this->iteration_count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  return;
}

Assistant:

auto     run_poly_vec()
    {
        for (auto c = 0U; c < iteration_count; c++) {
            std::for_each(
                derived().pv.begin(), derived().pv.end(), [](Interface& i) { i.doYourThing(); });
        }
    }